

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O1

int test_entities(void)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  xmlDocPtr pxVar11;
  long lVar12;
  undefined8 uVar13;
  xmlBufferPtr pxVar14;
  undefined8 uVar15;
  undefined4 uVar16;
  ulong uVar17;
  ulong *puVar18;
  int n_buf;
  ulong uVar19;
  ulong in_RSI;
  ulong uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  uint uVar23;
  undefined8 *puVar24;
  int n_content;
  uint uVar25;
  int n_content_1;
  int test_ret_2;
  int test_ret_3;
  int test_ret_4;
  int test_ret_1;
  int test_ret;
  int test_ret_10;
  int test_ret_9;
  
  if (quiet == '\0') {
    puts("Testing entities : 12 of 16 functions ...");
  }
  test_ret = 0;
  uVar5 = 0;
  do {
    uVar23 = 0;
    do {
      uVar1 = 0;
      do {
        uVar4 = 0;
        do {
          uVar17 = 0;
          do {
            puVar24 = &DAT_00159d60;
            uVar19 = 0;
            do {
              iVar3 = (int)in_RSI;
              iVar2 = xmlMemBlocks();
              pxVar11 = gen_xmlDocPtr(uVar5,iVar3);
              if (uVar23 < 4) {
                in_RSI = (&DAT_00159d60)[uVar23];
              }
              else {
                in_RSI = 0;
              }
              uVar16 = 0xffffffff;
              if (uVar1 < 4) {
                uVar16 = (&DAT_00157174)[uVar1];
              }
              if (uVar4 < 4) {
                uVar15 = (&DAT_00159d60)[uVar4];
              }
              else {
                uVar15 = 0;
              }
              if ((uint)uVar17 < 4) {
                uVar21 = (&DAT_00159d60)[uVar17];
              }
              else {
                uVar21 = 0;
              }
              uVar25 = (uint)uVar19;
              if (uVar25 < 4) {
                uVar22 = *puVar24;
              }
              else {
                uVar22 = 0;
              }
              lVar12 = xmlAddDocEntity(pxVar11,in_RSI,uVar16,uVar15,uVar21,uVar22);
              if (lVar12 != 0) {
                xmlUnlinkNode(lVar12);
                xmlFreeNode(lVar12);
              }
              call_tests = call_tests + 1;
              if (((pxVar11 != (xmlDocPtr)0x0) && (api_doc != pxVar11)) && (pxVar11->doc != api_doc)
                 ) {
                xmlFreeDoc(pxVar11);
              }
              xmlResetLastError();
              iVar3 = xmlMemBlocks();
              if (iVar2 != iVar3) {
                iVar3 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlAddDocEntity",(ulong)(uint)(iVar3 - iVar2));
                test_ret = test_ret + 1;
                printf(" %d",(ulong)uVar5);
                printf(" %d",(ulong)uVar23);
                printf(" %d",(ulong)uVar1);
                printf(" %d",(ulong)uVar4);
                printf(" %d",uVar17);
                printf(" %d");
                putchar(10);
                in_RSI = uVar19;
              }
              uVar25 = uVar25 + 1;
              uVar19 = (ulong)uVar25;
              puVar24 = puVar24 + 1;
            } while (uVar25 != 5);
            uVar25 = (uint)uVar17 + 1;
            uVar17 = (ulong)uVar25;
          } while (uVar25 != 5);
          uVar4 = uVar4 + 1;
        } while (uVar4 != 5);
        uVar1 = uVar1 + 1;
      } while (uVar1 != 4);
      uVar23 = uVar23 + 1;
    } while (uVar23 != 5);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 4);
  function_tests = function_tests + 1;
  test_ret_1 = 0;
  uVar5 = 0;
  do {
    uVar23 = 0;
    do {
      uVar1 = 0;
      do {
        uVar4 = 0;
        do {
          uVar17 = 0;
          do {
            puVar24 = &DAT_00159d60;
            uVar19 = 0;
            do {
              iVar3 = (int)in_RSI;
              iVar2 = xmlMemBlocks();
              pxVar11 = gen_xmlDocPtr(uVar5,iVar3);
              if (uVar23 < 4) {
                in_RSI = (&DAT_00159d60)[uVar23];
              }
              else {
                in_RSI = 0;
              }
              uVar16 = 0xffffffff;
              if (uVar1 < 4) {
                uVar16 = (&DAT_00157174)[uVar1];
              }
              if (uVar4 < 4) {
                uVar15 = (&DAT_00159d60)[uVar4];
              }
              else {
                uVar15 = 0;
              }
              if ((uint)uVar17 < 4) {
                uVar21 = (&DAT_00159d60)[uVar17];
              }
              else {
                uVar21 = 0;
              }
              uVar25 = (uint)uVar19;
              if (uVar25 < 4) {
                uVar22 = *puVar24;
              }
              else {
                uVar22 = 0;
              }
              lVar12 = xmlAddDtdEntity(pxVar11,in_RSI,uVar16,uVar15,uVar21,uVar22);
              if (lVar12 != 0) {
                xmlUnlinkNode(lVar12);
                xmlFreeNode(lVar12);
              }
              call_tests = call_tests + 1;
              if (((pxVar11 != (xmlDocPtr)0x0) && (api_doc != pxVar11)) && (pxVar11->doc != api_doc)
                 ) {
                xmlFreeDoc(pxVar11);
              }
              xmlResetLastError();
              iVar3 = xmlMemBlocks();
              if (iVar2 != iVar3) {
                iVar3 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlAddDtdEntity",(ulong)(uint)(iVar3 - iVar2));
                test_ret_1 = test_ret_1 + 1;
                printf(" %d",(ulong)uVar5);
                printf(" %d",(ulong)uVar23);
                printf(" %d",(ulong)uVar1);
                printf(" %d",(ulong)uVar4);
                printf(" %d",uVar17);
                printf(" %d");
                putchar(10);
                in_RSI = uVar19;
              }
              uVar25 = uVar25 + 1;
              uVar19 = (ulong)uVar25;
              puVar24 = puVar24 + 1;
            } while (uVar25 != 5);
            uVar25 = (uint)uVar17 + 1;
            uVar17 = (ulong)uVar25;
          } while (uVar25 != 5);
          uVar4 = uVar4 + 1;
        } while (uVar4 != 5);
        uVar1 = uVar1 + 1;
      } while (uVar1 != 4);
      uVar23 = uVar23 + 1;
    } while (uVar23 != 5);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 4);
  function_tests = function_tests + 1;
  test_ret_10 = 0;
  uVar5 = 0;
  do {
    uVar23 = 0;
    do {
      uVar1 = 0;
      do {
        uVar4 = 0;
        do {
          uVar17 = 0;
          do {
            uVar19 = 0;
            do {
              uVar25 = 0;
              puVar24 = &DAT_00159d60;
              do {
                iVar3 = (int)in_RSI;
                iVar2 = xmlMemBlocks();
                pxVar11 = gen_xmlDocPtr(uVar5,iVar3);
                in_RSI = 0xffffffff;
                if (uVar23 < 4) {
                  in_RSI = (ulong)(uint)(&DAT_00157174)[uVar23];
                }
                if (uVar1 < 4) {
                  uVar15 = (&DAT_00159d60)[uVar1];
                }
                else {
                  uVar15 = 0;
                }
                uVar16 = 0xffffffff;
                if (uVar4 < 4) {
                  uVar16 = (&DAT_00157174)[uVar4];
                }
                if ((uint)uVar17 < 4) {
                  uVar21 = (&DAT_00159d60)[uVar17];
                }
                else {
                  uVar21 = 0;
                }
                if ((uint)uVar19 < 4) {
                  uVar22 = (&DAT_00159d60)[uVar19];
                }
                else {
                  uVar22 = 0;
                }
                if (uVar25 < 4) {
                  uVar13 = *puVar24;
                }
                else {
                  uVar13 = 0;
                }
                xmlAddEntity(pxVar11,in_RSI,uVar15,uVar16,uVar21,uVar22,uVar13,0);
                call_tests = call_tests + 1;
                if (((pxVar11 != (xmlDocPtr)0x0) && (api_doc != pxVar11)) &&
                   (pxVar11->doc != api_doc)) {
                  xmlFreeDoc(pxVar11);
                }
                xmlResetLastError();
                iVar3 = xmlMemBlocks();
                if (iVar2 != iVar3) {
                  iVar3 = xmlMemBlocks();
                  printf("Leak of %d blocks found in xmlAddEntity",(ulong)(uint)(iVar3 - iVar2));
                  test_ret_10 = test_ret_10 + 1;
                  printf(" %d",(ulong)uVar5);
                  printf(" %d",(ulong)uVar23);
                  printf(" %d",(ulong)uVar1);
                  printf(" %d",(ulong)uVar4);
                  printf(" %d",uVar17);
                  printf(" %d",uVar19);
                  printf(" %d");
                  in_RSI = 0;
                  printf(" %d");
                  putchar(10);
                }
                uVar25 = uVar25 + 1;
                puVar24 = puVar24 + 1;
              } while (uVar25 != 5);
              uVar25 = (uint)uVar19 + 1;
              uVar19 = (ulong)uVar25;
            } while (uVar25 != 5);
            uVar25 = (uint)uVar17 + 1;
            uVar17 = (ulong)uVar25;
          } while (uVar25 != 5);
          uVar4 = uVar4 + 1;
        } while (uVar4 != 4);
        uVar1 = uVar1 + 1;
      } while (uVar1 != 5);
      uVar23 = uVar23 + 1;
    } while (uVar23 != 4);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 4);
  function_tests = function_tests + 1;
  test_ret_2 = 0;
  iVar2 = 0;
  do {
    iVar6 = (int)in_RSI;
    iVar3 = xmlMemBlocks();
    pxVar14 = gen_xmlBufferPtr(iVar2,iVar6);
    in_RSI = 0;
    xmlDumpEntitiesTable(pxVar14);
    call_tests = call_tests + 1;
    if (pxVar14 != (xmlBufferPtr)0x0) {
      xmlBufferFree(pxVar14);
    }
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar3 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlDumpEntitiesTable",(ulong)(uint)(iVar6 - iVar3));
      test_ret_2 = test_ret_2 + 1;
      printf(" %d");
      in_RSI = 0;
      printf(" %d");
      putchar(10);
    }
    iVar2 = iVar2 + 1;
  } while (iVar2 != 3);
  function_tests = function_tests + 1;
  iVar2 = 0;
  iVar3 = 0;
  do {
    iVar7 = (int)in_RSI;
    iVar6 = xmlMemBlocks();
    pxVar14 = gen_xmlBufferPtr(iVar3,iVar7);
    in_RSI = 0;
    xmlDumpEntityDecl(pxVar14);
    call_tests = call_tests + 1;
    if (pxVar14 != (xmlBufferPtr)0x0) {
      xmlBufferFree(pxVar14);
    }
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlDumpEntityDecl",(ulong)(uint)(iVar7 - iVar6));
      iVar2 = iVar2 + 1;
      printf(" %d");
      in_RSI = 0;
      printf(" %d");
      putchar(10);
    }
    iVar3 = iVar3 + 1;
  } while (iVar3 != 3);
  function_tests = function_tests + 1;
  iVar3 = 0;
  uVar5 = 0;
  do {
    puVar18 = &DAT_00159d60;
    uVar17 = 0;
    do {
      iVar7 = (int)in_RSI;
      iVar6 = xmlMemBlocks();
      pxVar11 = gen_xmlDocPtr(uVar5,iVar7);
      uVar23 = (uint)uVar17;
      if (uVar23 < 4) {
        in_RSI = *puVar18;
      }
      else {
        in_RSI = 0;
      }
      lVar12 = xmlEncodeEntitiesReentrant(pxVar11);
      if (lVar12 != 0) {
        (*_xmlFree)(lVar12);
      }
      call_tests = call_tests + 1;
      if (((pxVar11 != (xmlDocPtr)0x0) && (api_doc != pxVar11)) && (pxVar11->doc != api_doc)) {
        xmlFreeDoc(pxVar11);
      }
      xmlResetLastError();
      iVar7 = xmlMemBlocks();
      if (iVar6 != iVar7) {
        iVar7 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlEncodeEntitiesReentrant",(ulong)(uint)(iVar7 - iVar6))
        ;
        iVar3 = iVar3 + 1;
        printf(" %d",(ulong)uVar5);
        printf(" %d");
        putchar(10);
        in_RSI = uVar17;
      }
      uVar23 = uVar23 + 1;
      uVar17 = (ulong)uVar23;
      puVar18 = puVar18 + 1;
    } while (uVar23 != 5);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 4);
  iVar6 = test_ret_1 + test_ret + test_ret_10 + test_ret_2;
  function_tests = function_tests + 1;
  iVar7 = 0;
  test_ret_2 = 0;
  do {
    iVar8 = xmlMemBlocks();
    lVar12 = xmlEncodeSpecialChars(0);
    if (lVar12 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar8 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlEncodeSpecialChars",(ulong)(uint)(iVar9 - iVar8));
      test_ret_2 = test_ret_2 + 1;
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    iVar7 = iVar7 + 1;
  } while (iVar7 != 5);
  function_tests = function_tests + 1;
  puVar18 = &DAT_00159d60;
  uVar5 = 0;
  iVar7 = 0;
  do {
    iVar8 = xmlMemBlocks();
    if (uVar5 < 4) {
      uVar17 = *puVar18;
    }
    else {
      uVar17 = 0;
    }
    lVar12 = xmlGetDocEntity(0);
    if (lVar12 != 0) {
      xmlUnlinkNode(lVar12);
      xmlFreeNode();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar8 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlGetDocEntity",(ulong)(uint)(iVar9 - iVar8));
      iVar7 = iVar7 + 1;
      printf(" %d",0);
      uVar17 = (ulong)uVar5;
      printf(" %d");
      putchar(10);
    }
    uVar5 = uVar5 + 1;
    puVar18 = puVar18 + 1;
  } while (uVar5 != 5);
  function_tests = function_tests + 1;
  iVar8 = 0;
  uVar5 = 0;
  do {
    puVar18 = &DAT_00159d60;
    uVar19 = 0;
    do {
      iVar10 = (int)uVar17;
      iVar9 = xmlMemBlocks();
      pxVar11 = gen_xmlDocPtr(uVar5,iVar10);
      uVar23 = (uint)uVar19;
      if (uVar23 < 4) {
        uVar17 = *puVar18;
      }
      else {
        uVar17 = 0;
      }
      lVar12 = xmlGetDtdEntity(pxVar11);
      if (lVar12 != 0) {
        xmlUnlinkNode(lVar12);
        xmlFreeNode(lVar12);
      }
      call_tests = call_tests + 1;
      if (((pxVar11 != (xmlDocPtr)0x0) && (api_doc != pxVar11)) && (pxVar11->doc != api_doc)) {
        xmlFreeDoc(pxVar11);
      }
      xmlResetLastError();
      iVar10 = xmlMemBlocks();
      if (iVar9 != iVar10) {
        iVar10 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlGetDtdEntity",(ulong)(uint)(iVar10 - iVar9));
        iVar8 = iVar8 + 1;
        printf(" %d",(ulong)uVar5);
        printf(" %d");
        putchar(10);
        uVar17 = uVar19;
      }
      uVar23 = uVar23 + 1;
      uVar19 = (ulong)uVar23;
      puVar18 = puVar18 + 1;
    } while (uVar23 != 5);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 4);
  function_tests = function_tests + 1;
  test_ret = 0;
  uVar5 = 0;
  do {
    puVar18 = &DAT_00159d60;
    uVar19 = 0;
    do {
      iVar10 = (int)uVar17;
      iVar9 = xmlMemBlocks();
      pxVar11 = gen_xmlDocPtr(uVar5,iVar10);
      uVar23 = (uint)uVar19;
      if (uVar23 < 4) {
        uVar17 = *puVar18;
      }
      else {
        uVar17 = 0;
      }
      lVar12 = xmlGetParameterEntity(pxVar11);
      if (lVar12 != 0) {
        xmlUnlinkNode(lVar12);
        xmlFreeNode(lVar12);
      }
      call_tests = call_tests + 1;
      if (((pxVar11 != (xmlDocPtr)0x0) && (api_doc != pxVar11)) && (pxVar11->doc != api_doc)) {
        xmlFreeDoc(pxVar11);
      }
      xmlResetLastError();
      iVar10 = xmlMemBlocks();
      if (iVar9 != iVar10) {
        iVar10 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlGetParameterEntity",(ulong)(uint)(iVar10 - iVar9));
        test_ret = test_ret + 1;
        printf(" %d",(ulong)uVar5);
        printf(" %d");
        putchar(10);
        uVar17 = uVar19;
      }
      uVar23 = uVar23 + 1;
      uVar19 = (ulong)uVar23;
      puVar18 = puVar18 + 1;
    } while (uVar23 != 5);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 4);
  function_tests = function_tests + 1;
  puVar24 = &DAT_00159d60;
  uVar5 = 0;
  test_ret_9 = 0;
  do {
    iVar9 = xmlMemBlocks();
    if (uVar5 < 4) {
      uVar15 = *puVar24;
    }
    else {
      uVar15 = 0;
    }
    lVar12 = xmlGetPredefinedEntity(uVar15);
    if (lVar12 != 0) {
      xmlUnlinkNode(lVar12);
      xmlFreeNode();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar9 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlGetPredefinedEntity",(ulong)(uint)(iVar10 - iVar9));
      test_ret_9 = test_ret_9 + 1;
      uVar17 = (ulong)uVar5;
      printf(" %d");
      putchar(10);
    }
    uVar5 = uVar5 + 1;
    puVar24 = puVar24 + 1;
  } while (uVar5 != 5);
  function_tests = function_tests + 1;
  test_ret_10 = 0;
  uVar5 = 0;
  do {
    uVar23 = 0;
    do {
      uVar1 = 0;
      do {
        uVar4 = 0;
        do {
          uVar19 = 0;
          do {
            puVar24 = &DAT_00159d60;
            uVar20 = 0;
            do {
              iVar10 = (int)uVar17;
              iVar9 = xmlMemBlocks();
              pxVar11 = gen_xmlDocPtr(uVar5,iVar10);
              if (uVar23 < 4) {
                uVar17 = (&DAT_00159d60)[uVar23];
              }
              else {
                uVar17 = 0;
              }
              uVar16 = 0xffffffff;
              if (uVar1 < 4) {
                uVar16 = (&DAT_00157174)[uVar1];
              }
              if (uVar4 < 4) {
                uVar15 = (&DAT_00159d60)[uVar4];
              }
              else {
                uVar15 = 0;
              }
              if ((uint)uVar19 < 4) {
                uVar21 = (&DAT_00159d60)[uVar19];
              }
              else {
                uVar21 = 0;
              }
              uVar25 = (uint)uVar20;
              if (uVar25 < 4) {
                uVar22 = *puVar24;
              }
              else {
                uVar22 = 0;
              }
              lVar12 = xmlNewEntity(pxVar11,uVar17,uVar16,uVar15,uVar21,uVar22);
              if (lVar12 != 0) {
                xmlUnlinkNode(lVar12);
                xmlFreeNode(lVar12);
              }
              call_tests = call_tests + 1;
              if (((pxVar11 != (xmlDocPtr)0x0) && (api_doc != pxVar11)) && (pxVar11->doc != api_doc)
                 ) {
                xmlFreeDoc(pxVar11);
              }
              xmlResetLastError();
              iVar10 = xmlMemBlocks();
              if (iVar9 != iVar10) {
                iVar10 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlNewEntity",(ulong)(uint)(iVar10 - iVar9));
                test_ret_10 = test_ret_10 + 1;
                printf(" %d",(ulong)uVar5);
                printf(" %d",(ulong)uVar23);
                printf(" %d",(ulong)uVar1);
                printf(" %d",(ulong)uVar4);
                printf(" %d",uVar19);
                printf(" %d");
                putchar(10);
                uVar17 = uVar20;
              }
              uVar25 = uVar25 + 1;
              uVar20 = (ulong)uVar25;
              puVar24 = puVar24 + 1;
            } while (uVar25 != 5);
            uVar25 = (uint)uVar19 + 1;
            uVar19 = (ulong)uVar25;
          } while (uVar25 != 5);
          uVar4 = uVar4 + 1;
        } while (uVar4 != 5);
        uVar1 = uVar1 + 1;
      } while (uVar1 != 4);
      uVar23 = uVar23 + 1;
    } while (uVar23 != 5);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 4);
  function_tests = function_tests + 1;
  uVar5 = iVar6 + iVar2 + iVar3 + test_ret_2 + iVar7 + iVar8 + test_ret + test_ret_9 + test_ret_10;
  if (uVar5 != 0) {
    printf("Module entities: %d errors\n",(ulong)uVar5);
  }
  return uVar5;
}

Assistant:

static int
test_entities(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing entities : 12 of 16 functions ...\n");
    test_ret += test_xmlAddDocEntity();
    test_ret += test_xmlAddDtdEntity();
    test_ret += test_xmlAddEntity();
    test_ret += test_xmlCopyEntitiesTable();
    test_ret += test_xmlCreateEntitiesTable();
    test_ret += test_xmlDumpEntitiesTable();
    test_ret += test_xmlDumpEntityDecl();
    test_ret += test_xmlEncodeEntitiesReentrant();
    test_ret += test_xmlEncodeSpecialChars();
    test_ret += test_xmlGetDocEntity();
    test_ret += test_xmlGetDtdEntity();
    test_ret += test_xmlGetParameterEntity();
    test_ret += test_xmlGetPredefinedEntity();
    test_ret += test_xmlNewEntity();

    if (test_ret != 0)
	printf("Module entities: %d errors\n", test_ret);
    return(test_ret);
}